

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  byte bVar32;
  int iVar33;
  NodeRef *pNVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  size_t sVar40;
  ulong uVar41;
  float fVar42;
  uint uVar43;
  float fVar45;
  float fVar47;
  vint4 bi;
  uint uVar46;
  uint uVar48;
  float fVar49;
  uint uVar50;
  undefined1 auVar44 [16];
  float fVar51;
  float fVar57;
  float fVar60;
  vint4 ai;
  uint uVar52;
  uint uVar53;
  uint uVar58;
  uint uVar59;
  uint uVar61;
  uint uVar62;
  float fVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar66;
  float fVar67;
  uint uVar68;
  float fVar69;
  float fVar70;
  uint uVar71;
  float fVar72;
  float fVar73;
  vint4 ai_1;
  uint uVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  NodeRef *local_a88;
  ulong local_a68;
  undefined1 local_a18 [16];
  long local_a08;
  long local_a00;
  ulong local_9f8;
  undefined1 (*local_9f0) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_9f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = local_9f8 ^ 0x10;
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_a88 = stack + 1;
LAB_006e6d83:
  do {
    pNVar39 = local_a88;
    if (pNVar39 == stack) {
LAB_006e74ad:
      return pNVar39 != stack;
    }
    pNVar34 = pNVar39 + -1;
    sVar40 = pNVar39[-1].ptr;
    local_a88 = pNVar34;
    while ((sVar40 & 8) == 0) {
      pfVar1 = (float *)(sVar40 + 0x20 + local_9f8);
      fVar42 = (*pfVar1 - fVar5) * fVar8;
      fVar45 = (pfVar1[1] - fVar5) * fVar8;
      fVar47 = (pfVar1[2] - fVar5) * fVar8;
      fVar49 = (pfVar1[3] - fVar5) * fVar8;
      pfVar1 = (float *)(sVar40 + 0x20 + uVar36);
      fVar51 = (*pfVar1 - fVar6) * fVar9;
      fVar57 = (pfVar1[1] - fVar6) * fVar9;
      fVar60 = (pfVar1[2] - fVar6) * fVar9;
      fVar63 = (pfVar1[3] - fVar6) * fVar9;
      uVar52 = (uint)((int)fVar51 < (int)fVar42) * (int)fVar42 |
               (uint)((int)fVar51 >= (int)fVar42) * (int)fVar51;
      uVar58 = (uint)((int)fVar57 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar57 >= (int)fVar45) * (int)fVar57;
      uVar61 = (uint)((int)fVar60 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar60 >= (int)fVar47) * (int)fVar60;
      uVar64 = (uint)((int)fVar63 < (int)fVar49) * (int)fVar49 |
               (uint)((int)fVar63 >= (int)fVar49) * (int)fVar63;
      pfVar1 = (float *)(sVar40 + 0x20 + uVar41);
      fVar42 = (*pfVar1 - fVar7) * fVar10;
      fVar45 = (pfVar1[1] - fVar7) * fVar10;
      fVar47 = (pfVar1[2] - fVar7) * fVar10;
      fVar49 = (pfVar1[3] - fVar7) * fVar10;
      uVar43 = (uint)((int)fVar42 < iVar11) * iVar11 | (uint)((int)fVar42 >= iVar11) * (int)fVar42;
      uVar46 = (uint)((int)fVar45 < iVar11) * iVar11 | (uint)((int)fVar45 >= iVar11) * (int)fVar45;
      uVar48 = (uint)((int)fVar47 < iVar11) * iVar11 | (uint)((int)fVar47 >= iVar11) * (int)fVar47;
      uVar50 = (uint)((int)fVar49 < iVar11) * iVar11 | (uint)((int)fVar49 >= iVar11) * (int)fVar49;
      pfVar1 = (float *)(sVar40 + 0x20 + uVar37);
      fVar42 = (*pfVar1 - fVar5) * fVar8;
      fVar45 = (pfVar1[1] - fVar5) * fVar8;
      fVar47 = (pfVar1[2] - fVar5) * fVar8;
      fVar49 = (pfVar1[3] - fVar5) * fVar8;
      pfVar1 = (float *)(sVar40 + 0x20 + (uVar36 ^ 0x10));
      fVar51 = (*pfVar1 - fVar6) * fVar9;
      fVar57 = (pfVar1[1] - fVar6) * fVar9;
      fVar60 = (pfVar1[2] - fVar6) * fVar9;
      fVar63 = (pfVar1[3] - fVar6) * fVar9;
      uVar66 = (uint)((int)fVar42 < (int)fVar51) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar51) * (int)fVar51;
      uVar68 = (uint)((int)fVar45 < (int)fVar57) * (int)fVar45 |
               (uint)((int)fVar45 >= (int)fVar57) * (int)fVar57;
      uVar71 = (uint)((int)fVar47 < (int)fVar60) * (int)fVar47 |
               (uint)((int)fVar47 >= (int)fVar60) * (int)fVar60;
      uVar74 = (uint)((int)fVar49 < (int)fVar63) * (int)fVar49 |
               (uint)((int)fVar49 >= (int)fVar63) * (int)fVar63;
      pfVar1 = (float *)(sVar40 + 0x20 + (uVar41 ^ 0x10));
      fVar42 = (*pfVar1 - fVar7) * fVar10;
      fVar45 = (pfVar1[1] - fVar7) * fVar10;
      fVar47 = (pfVar1[2] - fVar7) * fVar10;
      fVar49 = (pfVar1[3] - fVar7) * fVar10;
      uVar53 = (uint)(iVar12 < (int)fVar42) * iVar12 | (uint)(iVar12 >= (int)fVar42) * (int)fVar42;
      uVar59 = (uint)(iVar12 < (int)fVar45) * iVar12 | (uint)(iVar12 >= (int)fVar45) * (int)fVar45;
      uVar62 = (uint)(iVar12 < (int)fVar47) * iVar12 | (uint)(iVar12 >= (int)fVar47) * (int)fVar47;
      uVar65 = (uint)(iVar12 < (int)fVar49) * iVar12 | (uint)(iVar12 >= (int)fVar49) * (int)fVar49;
      auVar55._0_4_ =
           -(uint)((int)(((int)uVar66 < (int)uVar53) * uVar66 |
                        ((int)uVar66 >= (int)uVar53) * uVar53) <
                  (int)(((int)uVar43 < (int)uVar52) * uVar52 | ((int)uVar43 >= (int)uVar52) * uVar43
                       ));
      auVar55._4_4_ =
           -(uint)((int)(((int)uVar68 < (int)uVar59) * uVar68 |
                        ((int)uVar68 >= (int)uVar59) * uVar59) <
                  (int)(((int)uVar46 < (int)uVar58) * uVar58 | ((int)uVar46 >= (int)uVar58) * uVar46
                       ));
      auVar55._8_4_ =
           -(uint)((int)(((int)uVar71 < (int)uVar62) * uVar71 |
                        ((int)uVar71 >= (int)uVar62) * uVar62) <
                  (int)(((int)uVar48 < (int)uVar61) * uVar61 | ((int)uVar48 >= (int)uVar61) * uVar48
                       ));
      auVar55._12_4_ =
           -(uint)((int)(((int)uVar74 < (int)uVar65) * uVar74 |
                        ((int)uVar74 >= (int)uVar65) * uVar65) <
                  (int)(((int)uVar50 < (int)uVar64) * uVar64 | ((int)uVar50 >= (int)uVar64) * uVar50
                       ));
      iVar33 = movmskps((int)pNVar34,auVar55);
      if (iVar33 == 0xf) goto LAB_006e6d83;
      bVar32 = (byte)iVar33 ^ 0xf;
      pNVar34 = (NodeRef *)(sVar40 & 0xfffffffffffffff0);
      lVar35 = 0;
      if (bVar32 != 0) {
        for (; (bVar32 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      sVar40 = pNVar34[lVar35].ptr;
      uVar43 = bVar32 - 1 & (uint)bVar32;
      uVar38 = (ulong)uVar43;
      if (uVar43 != 0) {
        do {
          local_a88->ptr = sVar40;
          local_a88 = local_a88 + 1;
          lVar35 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          sVar40 = pNVar34[lVar35].ptr;
          uVar38 = uVar38 - 1 & uVar38;
        } while (uVar38 != 0);
      }
    }
    local_a00 = (ulong)((uint)sVar40 & 0xf) - 8;
    uVar38 = sVar40 & 0xfffffffffffffff0;
    for (local_a08 = 0; local_a08 != local_a00; local_a08 = local_a08 + 1) {
      lVar35 = local_a08 * 0xb0;
      pfVar1 = (float *)(uVar38 + 0x80 + lVar35);
      fVar60 = *pfVar1;
      fVar63 = pfVar1[1];
      fVar86 = pfVar1[2];
      fVar87 = pfVar1[3];
      pfVar1 = (float *)(uVar38 + 0x40 + lVar35);
      fVar88 = *pfVar1;
      fVar95 = pfVar1[1];
      fVar97 = pfVar1[2];
      fVar99 = pfVar1[3];
      pfVar1 = (float *)(uVar38 + 0x70 + lVar35);
      fVar93 = *pfVar1;
      fVar83 = pfVar1[1];
      fVar84 = pfVar1[2];
      fVar85 = pfVar1[3];
      pfVar1 = (float *)(uVar38 + 0x50 + lVar35);
      fVar70 = *pfVar1;
      fVar73 = pfVar1[1];
      fVar76 = pfVar1[2];
      fVar23 = pfVar1[3];
      fVar67 = fVar93 * fVar70 - fVar60 * fVar88;
      fVar69 = fVar83 * fVar73 - fVar63 * fVar95;
      fVar72 = fVar84 * fVar76 - fVar86 * fVar97;
      fVar75 = fVar85 * fVar23 - fVar87 * fVar99;
      pfVar1 = (float *)(uVar38 + 0x60 + lVar35);
      fVar24 = *pfVar1;
      fVar25 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar27 = pfVar1[3];
      pfVar1 = (float *)(uVar38 + lVar35);
      pfVar2 = (float *)(uVar38 + 0x10 + lVar35);
      pfVar3 = (float *)(uVar38 + 0x20 + lVar35);
      pfVar4 = (float *)(uVar38 + 0x30 + lVar35);
      fVar28 = *pfVar4;
      fVar29 = pfVar4[1];
      fVar30 = pfVar4[2];
      fVar31 = pfVar4[3];
      local_888[0] = fVar60 * fVar28 - fVar70 * fVar24;
      local_888[1] = fVar63 * fVar29 - fVar73 * fVar25;
      local_888[2] = fVar86 * fVar30 - fVar76 * fVar26;
      local_888[3] = fVar87 * fVar31 - fVar23 * fVar27;
      fVar42 = *(float *)(ray + k * 4);
      fVar45 = *(float *)(ray + k * 4 + 0x20);
      fVar47 = *(float *)(ray + k * 4 + 0x40);
      fVar77 = *pfVar1 - fVar42;
      fVar78 = pfVar1[1] - fVar42;
      fVar79 = pfVar1[2] - fVar42;
      fVar42 = pfVar1[3] - fVar42;
      fVar89 = *pfVar3 - fVar45;
      fVar90 = pfVar3[1] - fVar45;
      fVar91 = pfVar3[2] - fVar45;
      fVar45 = pfVar3[3] - fVar45;
      fVar49 = *(float *)(ray + k * 4 + 0x60);
      fVar104 = fVar47 * fVar89 - fVar77 * fVar49;
      fVar105 = fVar47 * fVar90 - fVar78 * fVar49;
      fVar106 = fVar47 * fVar91 - fVar79 * fVar49;
      fVar107 = fVar47 * fVar45 - fVar42 * fVar49;
      local_878[0] = fVar88 * fVar24 - fVar93 * fVar28;
      local_878[1] = fVar95 * fVar25 - fVar83 * fVar29;
      local_878[2] = fVar97 * fVar26 - fVar84 * fVar30;
      local_878[3] = fVar99 * fVar27 - fVar85 * fVar31;
      fVar51 = *(float *)(ray + k * 4 + 0x10);
      fVar80 = *pfVar2 - fVar51;
      fVar81 = pfVar2[1] - fVar51;
      fVar82 = pfVar2[2] - fVar51;
      fVar51 = pfVar2[3] - fVar51;
      fVar57 = *(float *)(ray + k * 4 + 0x50);
      fVar92 = fVar49 * fVar80 - fVar57 * fVar89;
      fVar94 = fVar49 * fVar81 - fVar57 * fVar90;
      fVar96 = fVar49 * fVar82 - fVar57 * fVar91;
      fVar98 = fVar49 * fVar51 - fVar57 * fVar45;
      fVar108 = fVar57 * fVar77 - fVar47 * fVar80;
      fVar109 = fVar57 * fVar78 - fVar47 * fVar81;
      fVar110 = fVar57 * fVar79 - fVar47 * fVar82;
      fVar111 = fVar57 * fVar42 - fVar47 * fVar51;
      fVar100 = fVar49 * local_878[0] + local_888[0] * fVar57 + fVar67 * fVar47;
      fVar101 = fVar49 * local_878[1] + local_888[1] * fVar57 + fVar69 * fVar47;
      fVar102 = fVar49 * local_878[2] + local_888[2] * fVar57 + fVar72 * fVar47;
      fVar103 = fVar49 * local_878[3] + local_888[3] * fVar57 + fVar75 * fVar47;
      uVar46 = (uint)fVar100 & 0x80000000;
      uVar48 = (uint)fVar101 & 0x80000000;
      uVar50 = (uint)fVar102 & 0x80000000;
      uVar52 = (uint)fVar103 & 0x80000000;
      fVar47 = (float)((uint)(fVar24 * fVar92 + fVar93 * fVar104 + fVar60 * fVar108) ^ uVar46);
      fVar49 = (float)((uint)(fVar25 * fVar94 + fVar83 * fVar105 + fVar63 * fVar109) ^ uVar48);
      fVar57 = (float)((uint)(fVar26 * fVar96 + fVar84 * fVar106 + fVar86 * fVar110) ^ uVar50);
      fVar60 = (float)((uint)(fVar27 * fVar98 + fVar85 * fVar107 + fVar87 * fVar111) ^ uVar52);
      fVar93 = (float)((uint)(fVar92 * fVar28 + fVar104 * fVar88 + fVar108 * fVar70) ^ uVar46);
      fVar95 = (float)((uint)(fVar94 * fVar29 + fVar105 * fVar95 + fVar109 * fVar73) ^ uVar48);
      fVar97 = (float)((uint)(fVar96 * fVar30 + fVar106 * fVar97 + fVar110 * fVar76) ^ uVar50);
      fVar99 = (float)((uint)(fVar98 * fVar31 + fVar107 * fVar99 + fVar111 * fVar23) ^ uVar52);
      fVar63 = ABS(fVar100);
      fVar86 = ABS(fVar101);
      fVar87 = ABS(fVar102);
      fVar88 = ABS(fVar103);
      bVar21 = fVar47 + fVar93 <= fVar63 && ((0.0 <= fVar93 && 0.0 <= fVar47) && fVar100 != 0.0);
      bVar22 = fVar49 + fVar95 <= fVar86 && ((0.0 <= fVar95 && 0.0 <= fVar49) && fVar101 != 0.0);
      bVar20 = fVar57 + fVar97 <= fVar87 && ((0.0 <= fVar97 && 0.0 <= fVar57) && fVar102 != 0.0);
      bVar19 = fVar60 + fVar99 <= fVar88 && ((0.0 <= fVar99 && 0.0 <= fVar60) && fVar103 != 0.0);
      auVar18._4_4_ = -(uint)bVar22;
      auVar18._0_4_ = -(uint)bVar21;
      auVar18._8_4_ = -(uint)bVar20;
      auVar18._12_4_ = -(uint)bVar19;
      uVar43 = movmskps((int)pNVar34,auVar18);
      pNVar34 = (NodeRef *)(ulong)uVar43;
      if (uVar43 != 0) {
        fVar83 = (float)(uVar46 ^ (uint)(fVar77 * fVar67 +
                                        fVar80 * local_888[0] + fVar89 * local_878[0]));
        fVar84 = (float)(uVar48 ^ (uint)(fVar78 * fVar69 +
                                        fVar81 * local_888[1] + fVar90 * local_878[1]));
        fVar85 = (float)(uVar50 ^ (uint)(fVar79 * fVar72 +
                                        fVar82 * local_888[2] + fVar91 * local_878[2]));
        fVar51 = (float)(uVar52 ^ (uint)(fVar42 * fVar75 +
                                        fVar51 * local_888[3] + fVar45 * local_878[3]));
        fVar42 = *(float *)(ray + k * 4 + 0x30);
        fVar45 = *(float *)(ray + k * 4 + 0x80);
        auVar54._0_4_ = -(uint)((fVar83 <= fVar45 * fVar63 && fVar42 * fVar63 < fVar83) && bVar21);
        auVar54._4_4_ = -(uint)((fVar84 <= fVar45 * fVar86 && fVar42 * fVar86 < fVar84) && bVar22);
        auVar54._8_4_ = -(uint)((fVar85 <= fVar45 * fVar87 && fVar42 * fVar87 < fVar85) && bVar20);
        auVar54._12_4_ = -(uint)((fVar51 <= fVar45 * fVar88 && fVar42 * fVar88 < fVar51) && bVar19);
        uVar43 = movmskps(uVar43,auVar54);
        pNVar34 = (NodeRef *)(ulong)uVar43;
        if (uVar43 != 0) {
          local_898._4_4_ = fVar69;
          local_898._0_4_ = fVar67;
          local_898._8_4_ = fVar72;
          local_898._12_4_ = fVar75;
          pSVar13 = context->scene;
          auVar17._4_4_ = fVar86;
          auVar17._0_4_ = fVar63;
          auVar17._8_4_ = fVar87;
          auVar17._12_4_ = fVar88;
          auVar55 = rcpps(local_898,auVar17);
          fVar42 = auVar55._0_4_;
          fVar70 = auVar55._4_4_;
          fVar73 = auVar55._8_4_;
          fVar76 = auVar55._12_4_;
          fVar42 = (1.0 - fVar63 * fVar42) * fVar42 + fVar42;
          fVar70 = (1.0 - fVar86 * fVar70) * fVar70 + fVar70;
          fVar73 = (1.0 - fVar87 * fVar73) * fVar73 + fVar73;
          fVar76 = (1.0 - fVar88 * fVar76) * fVar76 + fVar76;
          local_8a8[0] = fVar83 * fVar42;
          local_8a8[1] = fVar84 * fVar70;
          local_8a8[2] = fVar85 * fVar73;
          local_8a8[3] = fVar51 * fVar76;
          local_8c8._0_4_ = fVar47 * fVar42;
          local_8c8._4_4_ = fVar49 * fVar70;
          local_8c8._8_4_ = fVar57 * fVar73;
          local_8c8._12_4_ = fVar60 * fVar76;
          local_8b8._0_4_ = fVar42 * fVar93;
          local_8b8._4_4_ = fVar70 * fVar95;
          local_8b8._8_4_ = fVar73 * fVar97;
          local_8b8._12_4_ = fVar76 * fVar99;
          local_a68 = (ulong)(byte)uVar43;
          do {
            uVar16 = 0;
            if (local_a68 != 0) {
              for (; (local_a68 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            local_808 = *(uint *)(lVar35 + uVar38 + 0x90 + uVar16 * 4);
            pGVar14 = (pSVar13->geometries).items[local_808].ptr;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_838 = *(undefined4 *)(local_8c8 + uVar16 * 4);
                fVar42 = local_8a8[uVar16 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar16];
                args.context = context->user;
                local_818 = *(undefined4 *)(lVar35 + uVar38 + 0xa0 + uVar16 * 4);
                local_828._4_4_ = fVar42;
                local_828._0_4_ = fVar42;
                local_828._8_4_ = fVar42;
                local_828._12_4_ = fVar42;
                local_868 = local_888[uVar16 - 4];
                local_858 = local_888[uVar16];
                local_848 = local_878[uVar16];
                fStack_864 = local_868;
                fStack_860 = local_868;
                fStack_85c = local_868;
                fStack_854 = local_858;
                fStack_850 = local_858;
                fStack_84c = local_858;
                fStack_844 = local_848;
                fStack_840 = local_848;
                fStack_83c = local_848;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_814 = local_818;
                uStack_810 = local_818;
                uStack_80c = local_818;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a18 = *local_9f0;
                args.valid = (int *)local_a18;
                args.geometryUserPtr = pGVar14->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->occlusionFilterN)(&args);
                }
                if (local_a18 == (undefined1  [16])0x0) {
                  auVar56._8_4_ = 0xffffffff;
                  auVar56._0_8_ = 0xffffffffffffffff;
                  auVar56._12_4_ = 0xffffffff;
                  auVar56 = auVar56 ^ _DAT_01f46b70;
                }
                else {
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var15)(&args);
                  }
                  auVar44._0_4_ = -(uint)(local_a18._0_4_ == 0);
                  auVar44._4_4_ = -(uint)(local_a18._4_4_ == 0);
                  auVar44._8_4_ = -(uint)(local_a18._8_4_ == 0);
                  auVar44._12_4_ = -(uint)(local_a18._12_4_ == 0);
                  auVar56 = auVar44 ^ _DAT_01f46b70;
                  auVar55 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar44);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                }
                if ((_DAT_01f46b40 & auVar56) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar45;
                  goto LAB_006e7401;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_006e74ad;
            }
LAB_006e7401:
            local_a68 = local_a68 ^ 1L << (uVar16 & 0x3f);
          } while (local_a68 != 0);
          pNVar34 = (NodeRef *)0x0;
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }